

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswCnf.c
# Opt level: O1

void Ssw_AddClausesMux(Ssw_Sat_t *p,Aig_Obj_t *pNode)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  uint uVar3;
  Aig_Obj_t *pAVar4;
  int iVar5;
  int Fill;
  int Fill_00;
  int Fill_01;
  int Fill_02;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int pLits [4];
  Aig_Obj_t *pNodeE;
  Aig_Obj_t *pNodeT;
  uint local_88;
  uint local_84;
  uint local_80;
  lit local_7c [2];
  uint local_74;
  uint local_70;
  undefined4 uStack_6c;
  Aig_Obj_t *local_68;
  Aig_Obj_t *local_60;
  Aig_Obj_t *local_58;
  uint local_50;
  uint local_4c;
  ulong local_48;
  ulong local_40;
  uint local_34;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Aig_IsComplement( pNode )",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswCnf.c"
                  ,0x6d,"void Ssw_AddClausesMux(Ssw_Sat_t *, Aig_Obj_t *)");
  }
  iVar5 = Aig_ObjIsMuxType(pNode);
  if (iVar5 == 0) {
    __assert_fail("Aig_ObjIsMuxType( pNode )",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswCnf.c"
                  ,0x6e,"void Ssw_AddClausesMux(Ssw_Sat_t *, Aig_Obj_t *)");
  }
  local_60 = Aig_ObjRecognizeMux(pNode,&local_58,(Aig_Obj_t **)&local_70);
  pVVar2 = p->vSatVars;
  iVar5 = pNode->Id;
  local_68 = pNode;
  Vec_IntFillExtra(pVVar2,iVar5 + 1,Fill);
  if ((-1 < (long)iVar5) && (iVar5 < pVVar2->nSize)) {
    local_74 = pVVar2->pArray[iVar5];
    pVVar2 = p->vSatVars;
    iVar5 = local_60->Id;
    Vec_IntFillExtra(pVVar2,iVar5 + 1,Fill_00);
    if ((-1 < (long)iVar5) && (iVar5 < pVVar2->nSize)) {
      iVar5 = pVVar2->pArray[iVar5];
      pVVar2 = p->vSatVars;
      iVar1 = *(int *)(((ulong)local_58 & 0xfffffffffffffffe) + 0x24);
      Vec_IntFillExtra(pVVar2,iVar1 + 1,Fill_01);
      if ((-1 < (long)iVar1) && (iVar1 < pVVar2->nSize)) {
        local_40 = (ulong)(uint)pVVar2->pArray[iVar1];
        pVVar2 = p->vSatVars;
        iVar1 = *(int *)((CONCAT44(uStack_6c,local_70) & 0xfffffffffffffffe) + 0x24);
        Vec_IntFillExtra(pVVar2,iVar1 + 1,Fill_02);
        pAVar4 = local_68;
        uVar7 = local_70;
        if ((-1 < (long)iVar1) && (iVar1 < pVVar2->nSize)) {
          local_48 = (ulong)(uint)pVVar2->pArray[iVar1];
          uVar9 = (uint)local_58 & 1;
          uVar3 = iVar5 * 2;
          uVar8 = iVar5 * 2 + 1;
          local_4c = uVar9 + (int)local_40 * 2;
          local_34 = local_4c ^ 1;
          local_74 = local_74 * 2;
          local_88 = uVar8;
          local_84 = local_34;
          local_80 = local_74;
          if (p->fPolarFlip != 0) {
            if ((local_60->field_0x18 & 8) != 0) {
              local_88 = uVar3;
            }
            if ((*(byte *)(((ulong)local_58 & 0xfffffffffffffffe) + 0x18) & 8) != 0) {
              local_84 = local_4c;
            }
            if ((local_68->field_0x18 & 8) != 0) {
              local_80 = local_74 | 1;
            }
          }
          iVar5 = sat_solver_addclause(p->pSat,(lit *)&local_88,local_7c);
          if (iVar5 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswCnf.c"
                          ,0x8c,"void Ssw_AddClausesMux(Ssw_Sat_t *, Aig_Obj_t *)");
          }
          uVar9 = uVar9 | (int)local_40 * 2;
          uVar6 = local_74 | 1;
          local_88 = uVar8;
          local_84 = uVar9;
          local_80 = uVar6;
          if (p->fPolarFlip != 0) {
            if ((local_60->field_0x18 & 8) != 0) {
              local_88 = uVar3;
            }
            if ((*(byte *)(((ulong)local_58 & 0xfffffffffffffffe) + 0x18) & 8) != 0) {
              local_84 = uVar9 ^ 1;
            }
            if ((pAVar4->field_0x18 & 8) != 0) {
              local_80 = local_74;
            }
          }
          iVar5 = sat_solver_addclause(p->pSat,(lit *)&local_88,local_7c);
          if (iVar5 != 0) {
            local_50 = (uVar7 & 1) + (int)local_48 * 2;
            uVar8 = local_50 ^ 1;
            local_80 = local_74;
            local_88 = uVar3;
            local_84 = uVar8;
            if (p->fPolarFlip != 0) {
              if ((local_60->field_0x18 & 8) != 0) {
                local_88 = uVar3 | 1;
              }
              if ((*(byte *)((CONCAT44(uStack_6c,local_70) & 0xfffffffffffffffe) + 0x18) & 8) != 0)
              {
                local_84 = local_50;
              }
              if ((local_68->field_0x18 & 8) != 0) {
                local_80 = uVar6;
              }
            }
            iVar5 = sat_solver_addclause(p->pSat,(lit *)&local_88,local_7c);
            if (iVar5 == 0) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswCnf.c"
                            ,0xa2,"void Ssw_AddClausesMux(Ssw_Sat_t *, Aig_Obj_t *)");
            }
            uVar7 = uVar7 & 1 | (int)local_48 * 2;
            local_88 = uVar3;
            local_84 = uVar7;
            local_80 = uVar6;
            if (p->fPolarFlip != 0) {
              if ((local_60->field_0x18 & 8) != 0) {
                local_88 = uVar3 | 1;
              }
              if ((*(byte *)((CONCAT44(uStack_6c,local_70) & 0xfffffffffffffffe) + 0x18) & 8) != 0)
              {
                local_84 = uVar7 ^ 1;
              }
              if ((local_68->field_0x18 & 8) != 0) {
                local_80 = local_74;
              }
            }
            iVar5 = sat_solver_addclause(p->pSat,(lit *)&local_88,local_7c);
            if (iVar5 == 0) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswCnf.c"
                            ,0xad,"void Ssw_AddClausesMux(Ssw_Sat_t *, Aig_Obj_t *)");
            }
            if ((int)local_40 != (int)local_48) {
              local_88 = uVar9;
              local_84 = uVar7;
              local_80 = uVar6;
              if (p->fPolarFlip != 0) {
                if ((*(byte *)(((ulong)local_58 & 0xfffffffffffffffe) + 0x18) & 8) != 0) {
                  local_88 = uVar9 ^ 1;
                }
                if ((*(byte *)((CONCAT44(uStack_6c,local_70) & 0xfffffffffffffffe) + 0x18) & 8) != 0
                   ) {
                  local_84 = uVar7 ^ 1;
                }
                if ((local_68->field_0x18 & 8) != 0) {
                  local_80 = local_74;
                }
              }
              iVar5 = sat_solver_addclause(p->pSat,(lit *)&local_88,local_7c);
              if (iVar5 == 0) {
                __assert_fail("RetValue",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswCnf.c"
                              ,0xc6,"void Ssw_AddClausesMux(Ssw_Sat_t *, Aig_Obj_t *)");
              }
              local_88 = local_34;
              local_80 = local_74;
              local_84 = uVar8;
              if (p->fPolarFlip != 0) {
                if ((*(byte *)(((ulong)local_58 & 0xfffffffffffffffe) + 0x18) & 8) != 0) {
                  local_88 = local_4c;
                }
                if ((*(byte *)((CONCAT44(uStack_6c,local_70) & 0xfffffffffffffffe) + 0x18) & 8) != 0
                   ) {
                  local_84 = local_50;
                }
                if ((local_68->field_0x18 & 8) != 0) {
                  local_80 = uVar6;
                }
              }
              iVar5 = sat_solver_addclause(p->pSat,(lit *)&local_88,local_7c);
              if (iVar5 == 0) {
                __assert_fail("RetValue",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswCnf.c"
                              ,0xd1,"void Ssw_AddClausesMux(Ssw_Sat_t *, Aig_Obj_t *)");
              }
            }
            return;
          }
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswCnf.c"
                        ,0x97,"void Ssw_AddClausesMux(Ssw_Sat_t *, Aig_Obj_t *)");
        }
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Ssw_AddClausesMux( Ssw_Sat_t * p, Aig_Obj_t * pNode )
{
    Aig_Obj_t * pNodeI, * pNodeT, * pNodeE;
    int pLits[4], RetValue, VarF, VarI, VarT, VarE, fCompT, fCompE;

    assert( !Aig_IsComplement( pNode ) );
    assert( Aig_ObjIsMuxType( pNode ) );
    // get nodes (I = if, T = then, E = else)
    pNodeI = Aig_ObjRecognizeMux( pNode, &pNodeT, &pNodeE );
    // get the variable numbers
    VarF = Ssw_ObjSatNum(p,pNode);
    VarI = Ssw_ObjSatNum(p,pNodeI);
    VarT = Ssw_ObjSatNum(p,Aig_Regular(pNodeT));
    VarE = Ssw_ObjSatNum(p,Aig_Regular(pNodeE));
    // get the complementation flags
    fCompT = Aig_IsComplement(pNodeT);
    fCompE = Aig_IsComplement(pNodeE);

    // f = ITE(i, t, e)

    // i' + t' + f
    // i' + t  + f'
    // i  + e' + f
    // i  + e  + f'

    // create four clauses
    pLits[0] = toLitCond(VarI, 1);
    pLits[1] = toLitCond(VarT, 1^fCompT);
    pLits[2] = toLitCond(VarF, 0);
    if ( p->fPolarFlip )
    {
        if ( pNodeI->fPhase )               pLits[0] = lit_neg( pLits[0] );
        if ( Aig_Regular(pNodeT)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 1);
    pLits[1] = toLitCond(VarT, 0^fCompT);
    pLits[2] = toLitCond(VarF, 1);
    if ( p->fPolarFlip )
    {
        if ( pNodeI->fPhase )               pLits[0] = lit_neg( pLits[0] );
        if ( Aig_Regular(pNodeT)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 0);
    pLits[1] = toLitCond(VarE, 1^fCompE);
    pLits[2] = toLitCond(VarF, 0);
    if ( p->fPolarFlip )
    {
        if ( pNodeI->fPhase )               pLits[0] = lit_neg( pLits[0] );
        if ( Aig_Regular(pNodeE)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 0);
    pLits[1] = toLitCond(VarE, 0^fCompE);
    pLits[2] = toLitCond(VarF, 1);
    if ( p->fPolarFlip )
    {
        if ( pNodeI->fPhase )               pLits[0] = lit_neg( pLits[0] );
        if ( Aig_Regular(pNodeE)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );

    // two additional clauses
    // t' & e' -> f'
    // t  & e  -> f

    // t  + e   + f'
    // t' + e'  + f

    if ( VarT == VarE )
    {
//        assert( fCompT == !fCompE );
        return;
    }

    pLits[0] = toLitCond(VarT, 0^fCompT);
    pLits[1] = toLitCond(VarE, 0^fCompE);
    pLits[2] = toLitCond(VarF, 1);
    if ( p->fPolarFlip )
    {
        if ( Aig_Regular(pNodeT)->fPhase )  pLits[0] = lit_neg( pLits[0] );
        if ( Aig_Regular(pNodeE)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarT, 1^fCompT);
    pLits[1] = toLitCond(VarE, 1^fCompE);
    pLits[2] = toLitCond(VarF, 0);
    if ( p->fPolarFlip )
    {
        if ( Aig_Regular(pNodeT)->fPhase )  pLits[0] = lit_neg( pLits[0] );
        if ( Aig_Regular(pNodeE)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
}